

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

hwaddr mips_cpu_get_phys_page_debug_mips64(CPUState *cs,vaddr addr)

{
  uint uVar1;
  int iVar2;
  uint access_type;
  int prot;
  hwaddr phys_addr;
  int in_stack_ffffffffffffffd8;
  int local_1c;
  ulong local_18;
  
  uVar1 = *(uint *)((long)cs[1].tb_jmp_cache + 0x485c);
  access_type = 3;
  if ((uVar1 >> 0x1c & 1) == 0) {
    access_type = uVar1 & 3;
  }
  iVar2 = get_physical_address
                    ((CPUMIPSState_conflict5 *)(cs[1].tb_jmp_cache + 0x143),&local_18,&local_1c,addr
                     ,0,access_type,in_stack_ffffffffffffffd8);
  return -(ulong)(iVar2 != 0) | local_18;
}

Assistant:

hwaddr mips_cpu_get_phys_page_debug(CPUState *cs, vaddr addr)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    hwaddr phys_addr;
    int prot;

    if (get_physical_address(env, &phys_addr, &prot, addr, 0, ACCESS_INT,
                             cpu_mmu_index(env, false)) != 0) {
        return -1;
    }
    return phys_addr;
}